

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall
soul::StructuralParser::parseAnnotation(StructuralParser *this,Annotation *annotation)

{
  pointer *ppPVar1;
  pointer pPVar2;
  iterator iVar3;
  bool bVar4;
  Property *pPVar5;
  UnqualifiedName *pUVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view newString;
  string name;
  Context context;
  string local_108;
  Context local_e8;
  Context local_d0;
  Property local_b8;
  UnqualifiedName *local_a8;
  Expression *pEStack_a0;
  CompileMessage local_68;
  
  pPVar2 = (annotation->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((annotation->properties).
      super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar2) {
    (annotation->properties).
    super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar2;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d4d);
  if (bVar4) {
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289a62);
    if (!bVar4) {
      do {
        local_e8.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object
        ;
        if (local_e8.location.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_e8.location.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_e8.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_e8.location.location.data = (this->super_SOULTokeniser).location.location.data;
        local_e8.parentScope = this->currentScope;
        parseAnnotationKey_abi_cxx11_(&local_108,this);
        checkLength(this,&local_108,0x80);
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&this->super_SOULTokeniser);
        pPVar5 = AST::Annotation::findProperty<std::__cxx11::string>(annotation,&local_108);
        if (pPVar5 != (Property *)0x0) {
          CompileMessageHelpers::createMessage<std::__cxx11::string&>
                    (&local_68,(CompileMessageHelpers *)0x1,none,0x2ab445,(char *)&local_108,in_R9);
          AST::Context::throwError(&local_e8,&local_68,false);
        }
        newString._M_str = local_108._M_dataplus._M_p;
        newString._M_len = local_108._M_string_length;
        local_a8 = (UnqualifiedName *)Identifier::Pool::get(&this->allocator->identifiers,newString)
        ;
        pUVar6 = PoolAllocator::
                 allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                           (&this->allocator->pool,&local_e8,(Identifier *)&local_a8);
        bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2b0192);
        if (bVar4) {
          local_a8 = pUVar6;
          pEStack_a0 = parseExpression(this,false);
          iVar3._M_current =
               (annotation->properties).
               super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (annotation->properties).
              super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<soul::AST::Annotation::Property,std::allocator<soul::AST::Annotation::Property>>
            ::_M_realloc_insert<soul::AST::Annotation::Property_const&>
                      ((vector<soul::AST::Annotation::Property,std::allocator<soul::AST::Annotation::Property>>
                        *)annotation,iVar3,(Property *)&local_a8);
          }
          else {
            ((iVar3._M_current)->name).object = local_a8;
            ((iVar3._M_current)->value).object = pEStack_a0;
            ppPVar1 = &(annotation->properties).
                       super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppPVar1 = *ppPVar1 + 1;
          }
        }
        else {
          local_d0.location.sourceCode.object =
               (this->super_SOULTokeniser).location.sourceCode.object;
          if (local_d0.location.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_d0.location.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_d0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_d0.location.location.data = (this->super_SOULTokeniser).location.location.data;
          local_d0.parentScope = this->currentScope;
          local_b8.name.object = pUVar6;
          soul::Value::Value((Value *)&local_a8,true);
          local_b8.value.object =
               &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                          (&this->allocator->pool,&local_d0,(Value *)&local_a8)->super_Expression;
          iVar3._M_current =
               (annotation->properties).
               super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (annotation->properties).
              super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<soul::AST::Annotation::Property,std::allocator<soul::AST::Annotation::Property>>
            ::_M_realloc_insert<soul::AST::Annotation::Property_const&>
                      ((vector<soul::AST::Annotation::Property,std::allocator<soul::AST::Annotation::Property>>
                        *)annotation,iVar3,&local_b8);
          }
          else {
            ((iVar3._M_current)->name).object = local_b8.name.object;
            ((iVar3._M_current)->value).object = local_b8.value.object;
            ppPVar1 = &(annotation->properties).
                       super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppPVar1 = *ppPVar1 + 1;
          }
          soul::Value::~Value((Value *)&local_a8);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d0.location.sourceCode.object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_e8.location.sourceCode.object);
        bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
      } while (bVar4);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289a62);
    }
  }
  return;
}

Assistant:

void parseAnnotation (AST::Annotation& annotation)
    {
        annotation.properties.clear();

        if (matchIf (Operator::openDoubleBracket))
        {
            if (matchIf (Operator::closeDoubleBracket))
                return;

            do
            {
                auto context = getContext();
                auto name = parseAnnotationKey();
                checkLength (name, AST::maxIdentifierLength);
                skip();

                if (annotation.findProperty (name) != nullptr)
                    context.throwError (Errors::nameInUse (name));

                auto& key = allocate<AST::UnqualifiedName> (context, allocator.get (name));

                if (matchIf (Operator::colon))
                    annotation.addProperty ({ key, parseExpression() });
                else
                    annotation.addProperty ({ key, allocate<AST::Constant> (getContext(), Value (true)) });
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeDoubleBracket);
        }
    }